

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getHeld(TestMoreStuffImpl *this,GetHeldContext context)

{
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Builder result;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  local_60;
  Maybe<capnp::MessageSize> local_58;
  Builder local_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_58.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::getResults(&local_40,&local_60,&local_58);
  capnproto_test::capnp::test::TestMoreStuff::GetHeldResults::Builder::setCap
            (&local_40,(Client *)(context.hook + 3));
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getHeld(GetHeldContext context) {
  ++callCount;
  auto result = context.getResults();
  result.setCap(clientToHold);
  return kj::READY_NOW;
}